

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::Picker::_q_dataChanged(Picker *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PickerPrivate *pPVar5;
  QAccessibleEvent event;
  QString local_58;
  undefined4 local_40;
  QModelIndex local_38;
  
  pPVar5 = (this->d).d;
  if (pPVar5->inserting != false) {
    return;
  }
  pQVar1 = topLeft->m;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58.d.d = (Data *)0xffffffffffffffff;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_58,pQVar1,topLeft);
    pPVar5 = (this->d).d;
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_38,&pPVar5->root);
  if (local_38.r != (int)local_58.d.d) {
    return;
  }
  if ((char16_t *)local_38.i != local_58.d.ptr) {
    return;
  }
  if (local_38.c != local_58.d.d._4_4_) {
    return;
  }
  if (local_38.m != (QAbstractItemModel *)local_58.d.size) {
    return;
  }
  iVar3 = QPersistentModelIndex::row();
  iVar4 = topLeft->r;
  if (iVar3 < iVar4) {
    iVar3 = bottomRight->r;
  }
  else {
    iVar4 = QPersistentModelIndex::row();
    iVar3 = bottomRight->r;
    if (iVar4 <= iVar3) {
      iVar4 = QPersistentModelIndex::row();
      itemText(&local_58,this,iVar4);
      currentTextChanged(this,&local_58);
      QWidget::update();
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
        }
      }
      goto LAB_0016e74b;
    }
    iVar4 = topLeft->r;
  }
  bVar2 = PickerPrivate::isRowsVisible((this->d).d,iVar4,iVar3);
  if (bVar2) {
    QWidget::update();
  }
LAB_0016e74b:
  local_58.d.d = (Data *)operator_new;
  local_58.d.ptr = (char16_t *)CONCAT44(local_58.d.ptr._4_4_,0x800c);
  local_40 = 0xffffffff;
  local_58.d.size = (qsizetype)this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
  return;
}

Assistant:

void
Picker::_q_dataChanged( const QModelIndex & topLeft,
	const QModelIndex & bottomRight )
{
	if( d->inserting || topLeft.parent() != d->root )
		return;

	if( d->currentIndex.row() >= topLeft.row() &&
		d->currentIndex.row() <= bottomRight.row() )
	{
		const QString text = itemText( d->currentIndex.row() );

		emit currentTextChanged( text );

		update();
	}
	else if( d->isIndexesVisible( topLeft, bottomRight ) )
		update();

#ifndef QT_NO_ACCESSIBILITY
	QAccessibleEvent event( this, QAccessible::NameChanged );
	QAccessible::updateAccessibility( &event );
#endif
}